

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_item(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
         item_event_visitor *visitor,error_code *ec)

{
  pointer pvVar1;
  ulong uVar2;
  pointer pmVar3;
  byte bVar4;
  uint uVar5;
  uint64_t uVar6;
  _func_int **pp_Var7;
  ulong extraout_RAX;
  semantic_tag tag;
  undefined8 uVar8;
  read_byte_string_from_source read;
  cbor_errc __e;
  basic_string_view<char,_std::char_traits<char>_> bStack_40;
  read_byte_string_from_buffer rStack_30;
  
  read_tags(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  if ((this->source_).buffer_length_ == 0) {
    stream_source<unsigned_char>::fill_buffer(&this->source_);
  }
  if ((this->source_).buffer_length_ == 0) {
    uVar5 = 0x100;
  }
  else {
    uVar5 = (uint)*(this->source_).buffer_data_;
  }
  if (0xff < uVar5) {
    __e = unexpected_eof;
LAB_00278db1:
    std::error_code::operator=(ec,__e);
    this->more_ = false;
    return;
  }
  bVar4 = (byte)uVar5 & 0x1f;
  switch(uVar5) {
  default:
    uVar6 = get_uint64_value(this,ec);
    if (ec->_M_value != 0) {
      return;
    }
    pvVar1 = (this->stringref_map_stack_).
             super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((this->stringref_map_stack_).
         super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start == pvVar1) ||
       (((this->other_tags_).super__Base_bitset<1UL>._M_w & 1) == 0)) {
      uVar2 = (this->other_tags_).super__Base_bitset<1UL>._M_w;
      if ((uVar2 & 4) == 0) {
        bVar4 = 0;
      }
      else {
        bVar4 = (this->raw_tag_ == 1) * '\x05';
        (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar2 & 0xfffffffffffffffb;
      }
      (*visitor->_vptr_basic_item_event_visitor[0xe])(visitor,uVar6,(ulong)bVar4,this,ec);
LAB_00278d1a:
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      break;
    }
    *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
         (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w & 0xfe;
    pmVar3 = pvVar1[-1].
             super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)pvVar1[-1].
                      super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3 >> 6) <= uVar6) {
      __e = stringref_too_large;
      goto LAB_00278db1;
    }
    if (pmVar3[uVar6].type == text_string) {
      bStack_40._M_str = pmVar3[uVar6].str._M_dataplus._M_p;
      bStack_40._M_len = pmVar3[uVar6].str._M_string_length;
      handle_string(this,visitor,&bStack_40,ec);
    }
    else {
      rStack_30.bytes.data_ =
           pmVar3[uVar6].bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      rStack_30.bytes.size_ =
           (long)pmVar3[uVar6].bytes.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)rStack_30.bytes.data_;
      basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
      write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_byte_string_from_buffer>
                ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
                 this,&rStack_30,visitor,ec);
    }
    goto LAB_00278c4d;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
    get_int64_value(this,ec);
    if (ec->_M_value != 0) {
      return;
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_item();
    break;
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
    write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_byte_string_from_source>
              ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
               this,(read_byte_string_from_source)this,visitor,ec);
LAB_00278c4d:
    if (ec->_M_value != 0) {
      return;
    }
    break;
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_item();
    if ((extraout_RAX & 1) != 0) {
      return;
    }
    break;
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
    if (((this->other_tags_).super__Base_bitset<1UL>._M_w & 4) == 0) {
      begin_array(this,visitor,bVar4,ec);
      break;
    }
    uVar6 = this->raw_tag_;
    if ((long)uVar6 < 0x28) {
      if (uVar6 == 4) {
        (this->text_buffer_)._M_string_length = 0;
        *(this->text_buffer_)._M_dataplus._M_p = '\0';
        read_decimal_fraction(this,&this->text_buffer_,ec);
        if (ec->_M_value != 0) {
          return;
        }
        bStack_40._M_str = (this->text_buffer_)._M_dataplus._M_p;
        bStack_40._M_len = (this->text_buffer_)._M_string_length;
        pp_Var7 = visitor->_vptr_basic_item_event_visitor;
        uVar8 = 3;
      }
      else {
        if (uVar6 != 5) {
code_r0x00278e4b:
          begin_array(this,visitor,bVar4,ec);
          goto LAB_00278ed6;
        }
        (this->text_buffer_)._M_string_length = 0;
        *(this->text_buffer_)._M_dataplus._M_p = '\0';
        read_bigfloat(this,&this->text_buffer_,ec);
        if (ec->_M_value != 0) {
          return;
        }
        bStack_40._M_str = (this->text_buffer_)._M_dataplus._M_p;
        bStack_40._M_len = (this->text_buffer_)._M_string_length;
        pp_Var7 = visitor->_vptr_basic_item_event_visitor;
        uVar8 = 10;
      }
      (*pp_Var7[0xb])(visitor,&bStack_40,uVar8,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
    }
    else {
      if (uVar6 == 0x28) {
        tag = multi_dim_row_major;
      }
      else {
        if (uVar6 != 0x410) goto code_r0x00278e4b;
        tag = multi_dim_column_major;
      }
      produce_begin_multi_dim(this,visitor,tag,ec);
    }
LAB_00278ed6:
    *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
         (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w & 0xfb;
    break;
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
    begin_object(this,visitor,bVar4,ec);
    break;
  case 0xc0:
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xd3:
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
    break;
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf3:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
  case 0xf8:
  case 0xf9:
  case 0xfa:
  case 0xfb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
    switch(bVar4) {
    case 0x14:
      pp_Var7 = visitor->_vptr_basic_item_event_visitor;
      uVar8 = 0;
      break;
    case 0x15:
      pp_Var7 = visitor->_vptr_basic_item_event_visitor;
      uVar8 = 1;
      break;
    case 0x16:
      pp_Var7 = visitor->_vptr_basic_item_event_visitor;
      uVar8 = 0;
      goto LAB_00278df6;
    case 0x17:
      pp_Var7 = visitor->_vptr_basic_item_event_visitor;
      uVar8 = 0xd;
LAB_00278df6:
      (*pp_Var7[9])(visitor,uVar8,this,ec);
      goto LAB_00278dff;
    default:
      __e = unknown_type;
      goto LAB_00278db1;
    case 0x19:
      uVar6 = get_uint64_value(this,ec);
      if (ec->_M_value != 0) {
        return;
      }
      (*visitor->_vptr_basic_item_event_visitor[0x10])(visitor,uVar6 & 0xffff,0,this,ec);
      goto LAB_00278d1a;
    case 0x1a:
    case 0x1b:
      get_double(this,ec);
      if (ec->_M_value != 0) {
        return;
      }
      basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_item();
      goto switchD_00278b69_caseD_c0;
    }
    (*pp_Var7[10])(visitor,uVar8,0,this,ec);
LAB_00278dff:
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
    stream_source<unsigned_char>::ignore(&this->source_,1);
  }
switchD_00278b69_caseD_c0:
  *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
       (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w & 0xfb;
  return;
}

Assistant:

void read_item(item_event_visitor& visitor, std::error_code& ec)
    {
        read_tags(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);
        uint8_t info = get_additional_information_value(c.value);

        switch (major_type)
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (!stringref_map_stack_.empty() && other_tags_[stringref_tag])
                {
                    other_tags_[stringref_tag] = false;
                    if (val >= stringref_map_stack_.back().size())
                    {
                        ec = cbor_errc::stringref_too_large;
                        more_ = false;
                        return;
                    }
                    auto index = static_cast<typename stringref_map::size_type>(val);
                    if (index != val)
                    {
                        ec = cbor_errc::number_too_large;
                        more_ = false;
                        return;
                    }
                    auto& str = stringref_map_stack_.back().at(index);
                    switch (str.type)
                    {
                        case jsoncons::cbor::detail::cbor_major_type::text_string:
                        {
                            handle_string(visitor, jsoncons::basic_string_view<char>(str.str.data(),str.str.length()),ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            break;
                        }
                        case jsoncons::cbor::detail::cbor_major_type::byte_string:
                        {
                            read_byte_string_from_buffer read(byte_string_view(str.bytes));
                            write_byte_string(read, visitor, ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            break;
                        }
                        default:
                            JSONCONS_UNREACHABLE();
                            break;
                    }
                }
                else
                {
                    semantic_tag tag = semantic_tag::none;
                    if (other_tags_[item_tag])
                    {
                        if (raw_tag_ == 1)
                        {
                            tag = semantic_tag::epoch_second;
                        }
                        other_tags_[item_tag] = false;
                    }
                    visitor.uint64_value(val, tag, *this, ec);
                    more_ = !cursor_mode_;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                semantic_tag tag = semantic_tag::none;
                if (other_tags_[item_tag])
                {
                    if (raw_tag_ == 1)
                    {
                        tag = semantic_tag::epoch_second;
                    }
                    other_tags_[item_tag] = false;
                }
                visitor.int64_value(val, tag, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::byte_string:
            {
                read_byte_string_from_source read(this);
                write_byte_string(read, visitor, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::text_string:
            {
                text_buffer_.clear();

                read_text_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(),text_buffer_.size());
                if (result.ec != unicode_traits::conv_errc())
                {
                    ec = cbor_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                handle_string(visitor, jsoncons::basic_string_view<char>(text_buffer_.data(),text_buffer_.length()),ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                JSONCONS_UNREACHABLE();
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::simple:
            {
                switch (info)
                {
                    case 0x14:
                        visitor.bool_value(false, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x15:
                        visitor.bool_value(true, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x16:
                        visitor.null_value(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x17:
                        visitor.null_value(semantic_tag::undefined, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x19: // Half-Precision Float (two-byte IEEE 754)
                    {
                        uint64_t val = get_uint64_value(ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        visitor.half_value(static_cast<uint16_t>(val), semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        break;
                    }
                    case 0x1a: // Single-Precision Float (four-byte IEEE 754)
                    case 0x1b: // Double-Precision Float (eight-byte IEEE 754)
                    {
                        double val = get_double(ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        semantic_tag tag = semantic_tag::none;
                        if (other_tags_[item_tag])
                        {
                            if (raw_tag_ == 1)
                            {
                                tag = semantic_tag::epoch_second;
                            }
                            other_tags_[item_tag] = false;
                        }
                        visitor.double_value(val, tag, *this, ec);
                        more_ = !cursor_mode_;
                        break;
                    }
                    default:
                    {
                        ec = cbor_errc::unknown_type;
                        more_ = false;
                        return;
                    }
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::array:
            {
                if (other_tags_[item_tag])
                {
                    switch (raw_tag_)
                    {
                        case 0x04:
                            text_buffer_.clear();
                            read_decimal_fraction(text_buffer_, ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            visitor.string_value(text_buffer_, semantic_tag::bigdec, *this, ec);
                            more_ = !cursor_mode_;
                            break;
                        case 0x05:
                            text_buffer_.clear();
                            read_bigfloat(text_buffer_, ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            visitor.string_value(text_buffer_, semantic_tag::bigfloat, *this, ec);
                            more_ = !cursor_mode_;
                            break;
                        case 40: // row major storage
                            produce_begin_multi_dim(visitor, semantic_tag::multi_dim_row_major, ec);
                            break;
                        case 1040: // column major storage
                            produce_begin_multi_dim(visitor, semantic_tag::multi_dim_column_major, ec);
                            break;
                        default:
                            begin_array(visitor, info, ec);
                            break;
                    }
                    other_tags_[item_tag] = false;
                }
                else
                {
                    begin_array(visitor, info, ec);
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::map:
            {
                begin_object(visitor, info, ec);
                break;
            }
            default:
                break;
        }
        other_tags_[item_tag] = false;
    }